

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::GlobalTypeRewriter::mapTypes::CodeUpdater::create(CodeUpdater *this)

{
  CodeUpdater *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>>const&)::CodeUpdater,std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>>const&>
            ((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
              *)&stack0xffffffffffffffe0);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>>const&)::CodeUpdater,std::default_delete<wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>>const&)::CodeUpdater>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<CodeUpdater,_std::default_delete<CodeUpdater>_> *)&stack0xffffffffffffffe0)
  ;
  std::unique_ptr<CodeUpdater,_std::default_delete<CodeUpdater>_>::~unique_ptr
            ((unique_ptr<CodeUpdater,_std::default_delete<CodeUpdater>_> *)&stack0xffffffffffffffe0)
  ;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<CodeUpdater>(oldToNewTypes);
    }